

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar
          (InterfaceVariableScalarReplacement *this,Instruction *var)

{
  IRContext *this_00;
  uint32_t uVar1;
  Instruction *this_01;
  uint uVar2;
  
  if (var->opcode_ != OpVariable) {
    __assert_fail("var->opcode() == spv::Op::OpVariable",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x254,
                  "uint32_t spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(Instruction *)"
                 );
  }
  uVar1 = 0;
  if (var->has_type_id_ == true) {
    uVar1 = Instruction::GetSingleWordOperand(var,0);
  }
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = analysis::DefUseManager::GetDef
                      ((this_00->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar1);
  if (this_01->opcode_ == OpTypePointer) {
    uVar2 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar2 = (uint)this_01->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(this_01,uVar2 + 1);
    return uVar1;
  }
  __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer && \"Variable must have a pointer type.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x25b,
                "uint32_t spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(Instruction *)"
               );
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(
    Instruction* var) {
  assert(var->opcode() == spv::Op::OpVariable);

  uint32_t ptr_type_id = var->type_id();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* ptr_type_inst = def_use_mgr->GetDef(ptr_type_id);

  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer &&
         "Variable must have a pointer type.");
  return ptr_type_inst->GetSingleWordInOperand(kOpTypePtrTypeInOperandIndex);
}